

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests-filenames.c
# Opt level: O0

greatest_test_res filenames_passed_null(void)

{
  char *local_20;
  char *filepath2;
  char *filepath;
  
  make_filepath(&filepath2,(char *)0x0,"");
  make_filepath(&local_20,"",(char *)0x0);
  if (filepath2 == (char *)0x0) {
    greatest_info.assertions = greatest_info.assertions + 2;
    if (local_20 == (char *)0x0) {
      greatest_info.msg = (char *)0x0;
      filepath._4_4_ = GREATEST_TEST_RES_PASS;
    }
    else {
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-filenames.c"
      ;
      greatest_info.fail_line = 0x2f;
      greatest_info.msg = "filepath2";
      if ((greatest_info.flags & 4) != 0) {
        abort();
      }
      filepath._4_4_ = GREATEST_TEST_RES_FAIL;
    }
  }
  else {
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/4rterius[P]cgtfs/tests/tests-filenames.c"
    ;
    greatest_info.fail_line = 0x2e;
    greatest_info.msg = "filepath";
    if ((greatest_info.flags & 4) != 0) {
      greatest_info.assertions = greatest_info.assertions + 1;
      abort();
    }
    filepath._4_4_ = GREATEST_TEST_RES_FAIL;
    greatest_info.assertions = greatest_info.assertions + 1;
  }
  return filepath._4_4_;
}

Assistant:

TEST filenames_passed_null(void) {
    char *filepath;
    char *filepath2;

    make_filepath(&filepath, NULL, "");
    make_filepath(&filepath2, "", NULL);

    ASSERT_FALSE(filepath);
    ASSERT_FALSE(filepath2);

    if (filepath)
        free(filepath);

    if (filepath2)
        free(filepath2);

    PASS();
}